

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

int unzGetCurrentFileInfo
              (unzFile file,unz_file_info *pfile_info,char *szFileName,uLong fileNameBufferSize,
              void *extraField,uLong extraFieldBufferSize,char *szComment,uLong commentBufferSize)

{
  int iVar1;
  undefined1 local_c8 [8];
  unz_file_info64 file_info64;
  int err;
  uLong extraFieldBufferSize_local;
  void *extraField_local;
  uLong fileNameBufferSize_local;
  char *szFileName_local;
  unz_file_info *pfile_info_local;
  unzFile file_local;
  
  iVar1 = unz64local_GetCurrentFileInfoInternal
                    (file,(unz_file_info64 *)local_c8,(unz_file_info64_internal *)0x0,szFileName,
                     fileNameBufferSize,extraField,extraFieldBufferSize,szComment,commentBufferSize)
  ;
  if (iVar1 == 0) {
    pfile_info->version = (uLong)local_c8;
    pfile_info->version_needed = file_info64.version;
    pfile_info->flag = file_info64.version_needed;
    pfile_info->compression_method = file_info64.flag;
    pfile_info->dosDate = file_info64.compression_method;
    pfile_info->crc = file_info64.dosDate;
    pfile_info->size_filename = file_info64.uncompressed_size;
    pfile_info->size_file_extra = file_info64.size_filename;
    pfile_info->size_file_comment = file_info64.size_file_extra;
    pfile_info->disk_num_start = file_info64.size_file_comment;
    pfile_info->internal_fa = file_info64.disk_num_start;
    pfile_info->external_fa = file_info64.internal_fa;
    (pfile_info->tmu_date).tm_sec = (undefined4)file_info64.external_fa;
    (pfile_info->tmu_date).tm_min = file_info64.external_fa._4_4_;
    (pfile_info->tmu_date).tm_hour = file_info64.tmu_date.tm_sec;
    (pfile_info->tmu_date).tm_mday = file_info64.tmu_date.tm_min;
    (pfile_info->tmu_date).tm_mon = file_info64.tmu_date.tm_hour;
    (pfile_info->tmu_date).tm_year = file_info64.tmu_date.tm_mday;
    pfile_info->compressed_size = file_info64.crc;
    pfile_info->uncompressed_size = file_info64.compressed_size;
  }
  return iVar1;
}

Assistant:

extern int ZEXPORT unzGetCurrentFileInfo(unzFile file,
    unz_file_info* pfile_info,
    char* szFileName, uLong fileNameBufferSize,
    void* extraField, uLong extraFieldBufferSize,
    char* szComment, uLong commentBufferSize)
{
    int err;
    unz_file_info64 file_info64;
    err = unz64local_GetCurrentFileInfoInternal(file, &file_info64, NULL,
        szFileName, fileNameBufferSize,
        extraField, extraFieldBufferSize,
        szComment, commentBufferSize);
    if (err == UNZ_OK)
    {
        pfile_info->version = file_info64.version;
        pfile_info->version_needed = file_info64.version_needed;
        pfile_info->flag = file_info64.flag;
        pfile_info->compression_method = file_info64.compression_method;
        pfile_info->dosDate = file_info64.dosDate;
        pfile_info->crc = file_info64.crc;

        pfile_info->size_filename = file_info64.size_filename;
        pfile_info->size_file_extra = file_info64.size_file_extra;
        pfile_info->size_file_comment = file_info64.size_file_comment;

        pfile_info->disk_num_start = file_info64.disk_num_start;
        pfile_info->internal_fa = file_info64.internal_fa;
        pfile_info->external_fa = file_info64.external_fa;

        pfile_info->tmu_date = file_info64.tmu_date,


            pfile_info->compressed_size = (uLong)file_info64.compressed_size;
        pfile_info->uncompressed_size = (uLong)file_info64.uncompressed_size;

    }
    return err;
}